

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecfloat.cpp
# Opt level: O2

ostream * operator<<(ostream *os,vec4f *v)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,'(');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->x);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->y);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->z);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->w);
  poVar1 = std::operator<<(poVar1,')');
  return poVar1;
}

Assistant:

std::ostream& operator << (std::ostream& os, const vec4f& v) {
	return os << '(' << v.x << ',' << v.y << ',' << v.z << ',' << v.w << ')';
}